

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

void __thiscall
google::protobuf::util::MessageDifferencer::TreatAsMap
          (MessageDifferencer *this,FieldDescriptor *field,FieldDescriptor *key)

{
  _Rb_tree_header *p_Var1;
  pointer *pppMVar2;
  Descriptor *pDVar3;
  iterator __position;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  MultipleFieldsMapKeyComparator *pMVar8;
  mapped_type *ppMVar9;
  _Base_ptr p_Var10;
  LogMessage local_e8;
  LogMessage local_b0;
  LogMessage local_78;
  MultipleFieldsMapKeyComparator *local_40;
  MapKeyComparator *key_comparator;
  FieldDescriptor *field_local;
  
  key_comparator = (MapKeyComparator *)field;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_e8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_78._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e8,
               (FieldDescriptor **)&local_78);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    protobuf::internal::LogMessage::LogMessage
              (&local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/message_differencer.cc"
               ,0x169);
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (&local_e8,
                        "CHECK failed: (FieldDescriptor::CPPTYPE_MESSAGE) == (field->cpp_type()): ")
    ;
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (pLVar4,"Field has to be message type.  Field name is: ");
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (pLVar4,(string *)key_comparator[1]._vptr_MapKeyComparator);
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar4);
    protobuf::internal::LogMessage::~LogMessage(&local_e8);
  }
  pDVar3 = *(Descriptor **)(key + 0x50);
  pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)key_comparator);
  if (pDVar3 != pDVar5) {
    protobuf::internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/message_differencer.cc"
               ,0x16b);
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (&local_78,"CHECK failed: key->containing_type() == field->message_type(): ")
    ;
    pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,*(string **)(key + 8));
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (pLVar4," must be a direct subfield within the repeated field ");
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (pLVar4,(string *)key_comparator[1]._vptr_MapKeyComparator);
    pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,", not ");
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (pLVar4,*(string **)(*(long *)(key + 0x50) + 8));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar4);
    protobuf::internal::LogMessage::~LogMessage(&local_78);
  }
  p_Var1 = &(this->repeated_field_comparisons_)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = (this->repeated_field_comparisons_)._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var10 != (_Base_ptr)0x0;
      p_Var10 = (&p_Var10->_M_left)[*(MapKeyComparator **)(p_Var10 + 1) < key_comparator]) {
    if (*(MapKeyComparator **)(p_Var10 + 1) >= key_comparator) {
      p_Var6 = p_Var10;
    }
  }
  p_Var10 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var10 = p_Var6, key_comparator < *(MapKeyComparator **)(p_Var6 + 1))) {
    p_Var10 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var10 != p_Var1) {
    protobuf::internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/message_differencer.cc"
               ,0x170);
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (&local_b0,
                        "CHECK failed: repeated_field_comparisons_.find(field) == repeated_field_comparisons_.end(): "
                       );
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (pLVar4,"Cannot treat the same field as both ");
    pmVar7 = std::
             map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
             ::operator[](&this->repeated_field_comparisons_,(key_type *)&key_comparator);
    pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4,*pmVar7);
    pLVar4 = protobuf::internal::LogMessage::operator<<(pLVar4," and MAP. Field name is: ");
    pLVar4 = protobuf::internal::LogMessage::operator<<
                       (pLVar4,(string *)key_comparator[1]._vptr_MapKeyComparator);
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar4);
    protobuf::internal::LogMessage::~LogMessage(&local_b0);
  }
  pMVar8 = (MultipleFieldsMapKeyComparator *)operator_new(0x28);
  MultipleFieldsMapKeyComparator::MultipleFieldsMapKeyComparator(pMVar8,this,key);
  __position._M_current =
       (this->owned_key_comparators_).
       super__Vector_base<google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::allocator<google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = pMVar8;
  if (__position._M_current ==
      (this->owned_key_comparators_).
      super__Vector_base<google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::allocator<google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::util::MessageDifferencer::MapKeyComparator*,std::allocator<google::protobuf::util::MessageDifferencer::MapKeyComparator*>>
    ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::MapKeyComparator*const&>
              ((vector<google::protobuf::util::MessageDifferencer::MapKeyComparator*,std::allocator<google::protobuf::util::MessageDifferencer::MapKeyComparator*>>
                *)&this->owned_key_comparators_,__position,(MapKeyComparator **)&local_40);
  }
  else {
    *__position._M_current = (MapKeyComparator *)pMVar8;
    pppMVar2 = &(this->owned_key_comparators_).
                super__Vector_base<google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::allocator<google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar2 = *pppMVar2 + 1;
  }
  pMVar8 = local_40;
  ppMVar9 = std::
            map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
            ::operator[](&this->map_field_key_comparator_,(key_type *)&key_comparator);
  *ppMVar9 = &pMVar8->super_MapKeyComparator;
  return;
}

Assistant:

void MessageDifferencer::TreatAsMap(const FieldDescriptor* field,
                                    const FieldDescriptor* key) {
  GOOGLE_CHECK_EQ(FieldDescriptor::CPPTYPE_MESSAGE, field->cpp_type())
      << "Field has to be message type.  Field name is: " << field->full_name();
  GOOGLE_CHECK(key->containing_type() == field->message_type())
      << key->full_name()
      << " must be a direct subfield within the repeated field "
      << field->full_name() << ", not " << key->containing_type()->full_name();
  GOOGLE_CHECK(repeated_field_comparisons_.find(field) ==
        repeated_field_comparisons_.end())
      << "Cannot treat the same field as both "
      << repeated_field_comparisons_[field]
      << " and MAP. Field name is: " << field->full_name();
  MapKeyComparator* key_comparator =
      new MultipleFieldsMapKeyComparator(this, key);
  owned_key_comparators_.push_back(key_comparator);
  map_field_key_comparator_[field] = key_comparator;
}